

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txpackage_tests.cpp
# Opt level: O0

void __thiscall txpackage_tests::package_rbf_tests::test_method(package_rbf_tests *this)

{
  long lVar1;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_00;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_01;
  initializer_list<transaction_identifier<true>_> __l_02;
  bool bVar2;
  pointer ppVar3;
  long in_FS_OFFSET;
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  *in_stack_ffffffffffffe248;
  CKey *this_00;
  char *pcVar4;
  WitnessV0KeyHash *in_stack_ffffffffffffe250;
  CMutableTransaction *pCVar5;
  CMutableTransaction *pCVar6;
  CTxMemPool *in_stack_ffffffffffffe258;
  uint uVar10;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *pvVar7;
  char *pcVar8;
  ulong uVar9;
  undefined4 in_stack_ffffffffffffe260;
  uint32_t in_stack_ffffffffffffe264;
  undefined4 in_stack_ffffffffffffe268;
  int in_stack_ffffffffffffe26c;
  undefined7 in_stack_ffffffffffffe270;
  undefined1 in_stack_ffffffffffffe277;
  CKey *in_stack_ffffffffffffe278;
  lazy_ostream *in_stack_ffffffffffffe280;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *in_stack_ffffffffffffe288;
  unit_test_log_t *this_01;
  undefined7 in_stack_ffffffffffffe290;
  undefined1 in_stack_ffffffffffffe297;
  size_type in_stack_ffffffffffffe298;
  GenTxid *in_stack_ffffffffffffe2a8;
  CTxMemPool *in_stack_ffffffffffffe2b0;
  undefined7 in_stack_ffffffffffffe2b8;
  undefined1 in_stack_ffffffffffffe2bf;
  Package *in_stack_ffffffffffffe2c0;
  CTxMemPool *in_stack_ffffffffffffe2c8;
  Chainstate *in_stack_ffffffffffffe2d0;
  undefined8 in_stack_ffffffffffffe340;
  CTxMemPool *in_stack_ffffffffffffe398;
  undefined8 in_stack_ffffffffffffe3a0;
  undefined1 expect_valid;
  undefined7 in_stack_ffffffffffffe3a8;
  undefined1 in_stack_ffffffffffffe3af;
  Package *in_stack_ffffffffffffe3b0;
  undefined8 in_stack_ffffffffffffe3d8;
  undefined1 uVar11;
  CKey *in_stack_ffffffffffffe3e0;
  undefined8 in_stack_ffffffffffffe3e8;
  CTransactionRef *in_stack_ffffffffffffe3f0;
  TestChain100Setup *in_stack_ffffffffffffe3f8;
  CScript *in_stack_ffffffffffffe580;
  CAmount in_stack_ffffffffffffe588;
  undefined1 *local_19e0;
  undefined1 *local_19b8;
  undefined1 *local_1990;
  int64_t package3_total_vsize;
  CAmount coinbase_value;
  package_rbf_tests *this_local;
  CKey *local_16a8;
  undefined1 local_16a0 [16];
  undefined1 local_1690 [68];
  CMutableTransaction local_164c;
  CMutableTransaction local_15ec;
  const_string local_1590 [2];
  lazy_ostream local_1570 [2];
  assertion_result local_1550 [2];
  const_string local_1518 [2];
  lazy_ostream local_14f8 [2];
  assertion_result local_14d8 [2];
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
  expected_package3_wtxids;
  const_string local_1480 [2];
  lazy_ostream local_1460 [2];
  assertion_result local_1440 [2];
  const_string local_1408 [2];
  lazy_ostream local_13e8 [2];
  assertion_result local_13c8 [2];
  CMutableTransaction local_138c;
  CMutableTransaction local_1334;
  const_iterator it_child_3;
  const_iterator it_parent_3;
  const_string local_12d0;
  lazy_ostream local_12c0 [2];
  assertion_result local_12a0 [2];
  unsigned_long local_1268;
  undefined1 local_1260 [16];
  undefined1 local_1250 [68];
  CMutableTransaction local_120c;
  CMutableTransaction local_11b4;
  const_iterator it_child_2_1;
  const_iterator it_parent_2_1;
  const_string local_1150;
  lazy_ostream local_1140 [2];
  assertion_result local_1120 [2];
  unsigned_long local_10e8;
  undefined1 local_10e0 [16];
  undefined1 local_10d0 [68];
  CMutableTransaction local_108c;
  undefined1 local_1034 [84];
  const_iterator it_child_1_1;
  const_iterator it_parent_1_1;
  const_string local_fd0;
  lazy_ostream local_fc0 [2];
  assertion_result local_fa0 [2];
  Package package3;
  Package package2_1;
  Package package1_1;
  const_string local_f08 [2];
  lazy_ostream local_ee8 [2];
  assertion_result local_ec8 [6];
  CTransactionRef tx_child_3;
  CTransactionRef tx_parent_3;
  CTransactionRef tx_child_2_1;
  CTransactionRef tx_parent_2;
  CTransactionRef tx_child_1_1;
  CTransactionRef tx_parent_1;
  const_string local_c20 [2];
  lazy_ostream local_c00 [2];
  assertion_result local_be0 [2];
  unsigned_long local_ba8;
  undefined1 local_ba0 [16];
  undefined1 local_b90 [68];
  CMutableTransaction local_b4c;
  CMutableTransaction local_af4;
  const_iterator it_child_2;
  const_iterator it_parent_2;
  const_string local_a90;
  lazy_ostream local_a80 [2];
  assertion_result local_a60 [2];
  unsigned_long local_a28;
  undefined1 local_a20 [16];
  undefined1 local_a10 [68];
  CMutableTransaction local_9cc;
  CMutableTransaction local_974;
  const_iterator it_child_1;
  const_iterator it_parent_1;
  const_string local_910;
  lazy_ostream local_900 [2];
  assertion_result local_8e0 [6];
  CTransactionRef tx_child_2;
  CTransactionRef tx_child_1;
  CTransactionRef tx_parent;
  CMutableTransaction mtx_parent;
  Package package2;
  Package package1;
  CKey grandchild_key;
  CKey child_key;
  size_t expected_pool_size;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock24;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock23;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> err_3;
  PackageMempoolAcceptResult submit3;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> err_2_1
  ;
  PackageMempoolAcceptResult submit2_1;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> err_1_1
  ;
  PackageMempoolAcceptResult submit1_1;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [64];
  undefined1 local_3e0 [64];
  undefined1 local_3a0 [104];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> err_2;
  PackageMempoolAcceptResult submit2;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> err_1;
  PackageMempoolAcceptResult submit1;
  undefined1 local_1f8 [64];
  CKey local_1b8 [12];
  CScript child_spk;
  CScript parent_spk;
  
  local_1034._52_8_ = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  TestChain100Setup::mineBlocks
            ((TestChain100Setup *)CONCAT17(in_stack_ffffffffffffe297,in_stack_ffffffffffffe290),
             (int)((ulong)in_stack_ffffffffffffe288 >> 0x20));
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffe248);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffe288,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffe280,
             &in_stack_ffffffffffffe278->fCompressed,
             (char *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270),
             in_stack_ffffffffffffe26c,SUB41((uint)in_stack_ffffffffffffe268 >> 0x18,0));
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)in_stack_ffffffffffffe248);
  expected_pool_size = CTxMemPool::size(in_stack_ffffffffffffe258);
  GenerateRandomKey(SUB81((ulong)in_stack_ffffffffffffe250 >> 0x38,0));
  CKey::GetPubKey((CKey *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270));
  WitnessV0KeyHash::WitnessV0KeyHash
            ((WitnessV0KeyHash *)CONCAT44(in_stack_ffffffffffffe264,in_stack_ffffffffffffe260),
             (CPubKey *)in_stack_ffffffffffffe258);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<WitnessV0KeyHash,void,void,WitnessV0KeyHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffe258,in_stack_ffffffffffffe250);
  GetScriptForDestination(in_stack_ffffffffffffe248);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant(in_stack_ffffffffffffe248);
  GenerateRandomKey(SUB81((ulong)in_stack_ffffffffffffe250 >> 0x38,0));
  CKey::GetPubKey((CKey *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270));
  WitnessV0KeyHash::WitnessV0KeyHash
            ((WitnessV0KeyHash *)CONCAT44(in_stack_ffffffffffffe264,in_stack_ffffffffffffe260),
             (CPubKey *)in_stack_ffffffffffffe258);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<WitnessV0KeyHash,void,void,WitnessV0KeyHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffe258,in_stack_ffffffffffffe250);
  GetScriptForDestination(in_stack_ffffffffffffe248);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant(in_stack_ffffffffffffe248);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)in_stack_ffffffffffffe248);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)in_stack_ffffffffffffe248);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_ffffffffffffe258,(size_type)in_stack_ffffffffffffe250);
  uVar10 = (uint)((ulong)in_stack_ffffffffffffe258 >> 0x20);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffe248,
             (shared_ptr<const_CTransaction> *)0xb80959);
  CKey::CKey(in_stack_ffffffffffffe278,
             (CKey *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270));
  CScript::CScript((CScript *)in_stack_ffffffffffffe248,(CScript *)0xb8098c);
  pCVar5 = (CMutableTransaction *)&DAT_12a05f138;
  this_00 = local_1b8;
  pvVar7 = (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)((ulong)uVar10 << 0x20);
  TestChain100Setup::CreateValidMempoolTransaction
            (in_stack_ffffffffffffe3f8,in_stack_ffffffffffffe3f0,
             (uint32_t)((ulong)in_stack_ffffffffffffe3e8 >> 0x20),(int)in_stack_ffffffffffffe3e8,
             in_stack_ffffffffffffe3e0,in_stack_ffffffffffffe580,in_stack_ffffffffffffe588,
             SUB81((ulong)in_stack_ffffffffffffe3d8 >> 0x38,0));
  CScript::~CScript((CScript *)this_00);
  CKey::~CKey(this_00);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_00);
  MakeTransactionRef<CMutableTransaction&>(pCVar5);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back(pvVar7,(value_type *)pCVar5);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back(pvVar7,(value_type *)pCVar5);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)this_00,(shared_ptr<const_CTransaction> *)0xb80a5f);
  CKey::CKey(in_stack_ffffffffffffe278,
             (CKey *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270));
  CScript::CScript((CScript *)this_00,(CScript *)0xb80a8b);
  pCVar6 = (CMutableTransaction *)0x12a05f00c;
  pCVar5 = (CMutableTransaction *)(local_1f8 + 0x20);
  pvVar7 = (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)((ulong)pvVar7 & 0xffffffff00000000);
  TestChain100Setup::CreateValidMempoolTransaction
            (in_stack_ffffffffffffe3f8,in_stack_ffffffffffffe3f0,
             (uint32_t)((ulong)in_stack_ffffffffffffe3e8 >> 0x20),(int)in_stack_ffffffffffffe3e8,
             in_stack_ffffffffffffe3e0,in_stack_ffffffffffffe580,in_stack_ffffffffffffe588,
             SUB81((ulong)in_stack_ffffffffffffe3d8 >> 0x38,0));
  ::MakeTransactionRef<CMutableTransaction>(pCVar6);
  CMutableTransaction::~CMutableTransaction(pCVar5);
  CScript::~CScript((CScript *)pCVar5);
  CKey::~CKey((CKey *)pCVar5);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pCVar5);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back(pvVar7,(value_type *)pCVar6);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)pCVar5,(shared_ptr<const_CTransaction> *)0xb80b56);
  CKey::CKey(in_stack_ffffffffffffe278,
             (CKey *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270));
  CScript::CScript((CScript *)pCVar5,(CScript *)0xb80b82);
  pCVar5 = (CMutableTransaction *)&DAT_12a05ef44;
  pcVar4 = local_1f8;
  pcVar8 = (char *)((ulong)pvVar7 & 0xffffffff00000000);
  TestChain100Setup::CreateValidMempoolTransaction
            (in_stack_ffffffffffffe3f8,in_stack_ffffffffffffe3f0,
             (uint32_t)((ulong)in_stack_ffffffffffffe3e8 >> 0x20),(int)in_stack_ffffffffffffe3e8,
             in_stack_ffffffffffffe3e0,in_stack_ffffffffffffe580,in_stack_ffffffffffffe588,
             SUB81((ulong)in_stack_ffffffffffffe3d8 >> 0x38,0));
  ::MakeTransactionRef<CMutableTransaction>(pCVar5);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)pcVar4);
  CScript::~CScript((CScript *)pcVar4);
  CKey::~CKey((CKey *)pcVar4);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pcVar4);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)pcVar8,(value_type *)pCVar5);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar4);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)pcVar4);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffe288,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffe280,
             &in_stack_ffffffffffffe278->fCompressed,
             (char *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270),
             in_stack_ffffffffffffe26c,SUB41((uint)in_stack_ffffffffffffe268 >> 0x18,0));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar4);
  ChainstateManager::ActiveChainstate((ChainstateManager *)pcVar8);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator*
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar8);
  std::optional<CFeeRate>::optional();
  ProcessNewPackage(in_stack_ffffffffffffe2d0,in_stack_ffffffffffffe2c8,in_stack_ffffffffffffe2c0,
                    SUB81((ulong)in_stack_ffffffffffffe340 >> 0x38,0),
                    (optional<CFeeRate> *)
                    CONCAT17(in_stack_ffffffffffffe2bf,in_stack_ffffffffffffe2b8));
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::get
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar4);
  CheckPackageMempoolAcceptResult_abi_cxx11_
            (in_stack_ffffffffffffe3b0,
             (PackageMempoolAcceptResult *)
             CONCAT17(in_stack_ffffffffffffe3af,in_stack_ffffffffffffe3a8),
             SUB81((ulong)in_stack_ffffffffffffe3a0 >> 0x38,0),in_stack_ffffffffffffe398);
  bVar2 = std::optional::operator_cast_to_bool
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)pcVar4);
  if (bVar2) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar4);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffe288,
                 (const_string *)in_stack_ffffffffffffe280,(size_t)in_stack_ffffffffffffe278,
                 (const_string *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar8,SUB81((ulong)pCVar5 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)pcVar8);
      boost::unit_test::operator<<
                ((lazy_ostream *)pCVar5,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar4);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
      pcVar4 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_8e0,local_900,&local_910,0x3d0,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)pcVar4);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar4);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)pcVar4);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             pcVar4);
  CTransaction::GetWitnessHash((CTransaction *)pcVar4);
  transaction_identifier::operator_cast_to_uint256_((transaction_identifier<true> *)pcVar4);
  std::
  map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  ::find((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
          *)pCVar5,(key_type *)pcVar4);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             pcVar4);
  CTransaction::GetWitnessHash((CTransaction *)pcVar4);
  transaction_identifier::operator_cast_to_uint256_((transaction_identifier<true> *)pcVar4);
  it_child_1 = std::
               map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
               ::find((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                       *)pCVar5,(key_type *)pcVar4);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar4);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe288,
               (const_string *)in_stack_ffffffffffffe280,(size_t)in_stack_ffffffffffffe278,
               (const_string *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pCVar5,(char (*) [1])pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::
             operator->((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)
                        pcVar4);
    local_974.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = 0;
    pcVar8 = "MempoolAcceptResult::ResultType::VALID";
    pCVar5 = &local_974;
    pcVar4 = "it_parent_1->second.m_result_type";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,MempoolAcceptResult::ResultType,MempoolAcceptResult::ResultType>
              ((undefined1 *)
               ((long)&local_974.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4),
               (undefined1 *)
               ((long)&local_974.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start + 4),0x3d6,1,2,&ppVar3->second);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar4);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar4);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe288,
               (const_string *)in_stack_ffffffffffffe280,(size_t)in_stack_ffffffffffffe278,
               (const_string *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pCVar5,(char (*) [1])pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::
             operator->((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)
                        pcVar4);
    local_9cc.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = 0;
    pcVar8 = "MempoolAcceptResult::ResultType::VALID";
    pCVar5 = &local_9cc;
    pcVar4 = "it_child_1->second.m_result_type";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,MempoolAcceptResult::ResultType,MempoolAcceptResult::ResultType>
              ((undefined1 *)
               ((long)&local_9cc.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4),
               (undefined1 *)
               ((long)&local_9cc.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start + 4),0x3d7,1,2,&ppVar3->second);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar4);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  expected_pool_size = expected_pool_size + 2;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar4);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe288,
               (const_string *)in_stack_ffffffffffffe280,(size_t)in_stack_ffffffffffffe278,
               (const_string *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pCVar5,(char (*) [1])pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
              ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar4);
    local_a28 = CTxMemPool::size((CTxMemPool *)pcVar8);
    pcVar8 = "expected_pool_size";
    pCVar5 = (CMutableTransaction *)&expected_pool_size;
    pcVar4 = "m_node.mempool->size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_a10,local_a20,0x3d9,1,2,&local_a28);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar4);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar4);
  ChainstateManager::ActiveChainstate((ChainstateManager *)pcVar8);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator*
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar8);
  std::optional<CFeeRate>::optional();
  ProcessNewPackage(in_stack_ffffffffffffe2d0,in_stack_ffffffffffffe2c8,in_stack_ffffffffffffe2c0,
                    SUB81((ulong)in_stack_ffffffffffffe340 >> 0x38,0),
                    (optional<CFeeRate> *)
                    CONCAT17(in_stack_ffffffffffffe2bf,in_stack_ffffffffffffe2b8));
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::get
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar4);
  CheckPackageMempoolAcceptResult_abi_cxx11_
            (in_stack_ffffffffffffe3b0,
             (PackageMempoolAcceptResult *)
             CONCAT17(in_stack_ffffffffffffe3af,in_stack_ffffffffffffe3a8),
             SUB81((ulong)in_stack_ffffffffffffe3a0 >> 0x38,0),in_stack_ffffffffffffe398);
  bVar2 = std::optional::operator_cast_to_bool
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)pcVar4);
  if (bVar2) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar4);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffe288,
                 (const_string *)in_stack_ffffffffffffe280,(size_t)in_stack_ffffffffffffe278,
                 (const_string *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar8,SUB81((ulong)pCVar5 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)pcVar8);
      boost::unit_test::operator<<
                ((lazy_ostream *)pCVar5,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar4);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
      pcVar4 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_a60,local_a80,&local_a90,0x3dd,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)pcVar4);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar4);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)pcVar4);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             pcVar4);
  CTransaction::GetWitnessHash((CTransaction *)pcVar4);
  transaction_identifier::operator_cast_to_uint256_((transaction_identifier<true> *)pcVar4);
  std::
  map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  ::find((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
          *)pCVar5,(key_type *)pcVar4);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             pcVar4);
  CTransaction::GetWitnessHash((CTransaction *)pcVar4);
  transaction_identifier::operator_cast_to_uint256_((transaction_identifier<true> *)pcVar4);
  it_child_2 = std::
               map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
               ::find((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                       *)pCVar5,(key_type *)pcVar4);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar4);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe288,
               (const_string *)in_stack_ffffffffffffe280,(size_t)in_stack_ffffffffffffe278,
               (const_string *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pCVar5,(char (*) [1])pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::
             operator->((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)
                        pcVar4);
    local_af4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = 2;
    pcVar8 = "MempoolAcceptResult::ResultType::MEMPOOL_ENTRY";
    pCVar5 = &local_af4;
    pcVar4 = "it_parent_2->second.m_result_type";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,MempoolAcceptResult::ResultType,MempoolAcceptResult::ResultType>
              ((undefined1 *)
               ((long)&local_af4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4),
               (undefined1 *)
               ((long)&local_af4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start + 4),0x3e3,1,2,&ppVar3->second);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar4);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar4);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe288,
               (const_string *)in_stack_ffffffffffffe280,(size_t)in_stack_ffffffffffffe278,
               (const_string *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pCVar5,(char (*) [1])pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::
             operator->((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)
                        pcVar4);
    local_b4c.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = 0;
    pcVar8 = "MempoolAcceptResult::ResultType::VALID";
    pCVar5 = &local_b4c;
    pcVar4 = "it_child_2->second.m_result_type";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,MempoolAcceptResult::ResultType,MempoolAcceptResult::ResultType>
              ((undefined1 *)
               ((long)&local_b4c.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4),
               (undefined1 *)
               ((long)&local_b4c.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start + 4),0x3e4,1,2,&ppVar3->second);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar4);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar4);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe288,
               (const_string *)in_stack_ffffffffffffe280,(size_t)in_stack_ffffffffffffe278,
               (const_string *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pCVar5,(char (*) [1])pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
              ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar4);
    local_ba8 = CTxMemPool::size((CTxMemPool *)pcVar8);
    pcVar8 = "expected_pool_size";
    pCVar5 = (CMutableTransaction *)&expected_pool_size;
    pcVar4 = "m_node.mempool->size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_b90,local_ba0,0x3e5,1,2,&local_ba8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar4);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar4);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe288,
               (const_string *)in_stack_ffffffffffffe280,(size_t)in_stack_ffffffffffffe278,
               (const_string *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270));
    std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
              ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar4);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               pcVar4);
    CTransaction::GetHash((CTransaction *)pcVar4);
    transaction_identifier::operator_cast_to_uint256_((transaction_identifier<false> *)pcVar4);
    GenTxid::Txid((uint256 *)pcVar4);
    CTxMemPool::exists(in_stack_ffffffffffffe2b0,in_stack_ffffffffffffe2a8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)pcVar8,SUB81((ulong)pCVar5 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    boost::unit_test::operator<<((lazy_ostream *)pCVar5,(basic_cstring<const_char> *)pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    pcVar4 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_be0,local_c00,local_c20,1000,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pcVar4);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar4);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
    uVar11 = (undefined1)((ulong)in_stack_ffffffffffffe3d8 >> 0x38);
  } while (bVar2);
  PackageMempoolAcceptResult::~PackageMempoolAcceptResult((PackageMempoolAcceptResult *)pcVar4);
  PackageMempoolAcceptResult::~PackageMempoolAcceptResult((PackageMempoolAcceptResult *)pcVar4);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)pcVar4);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pcVar4);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pcVar4);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pcVar4);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)pcVar4);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)pcVar8);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)pcVar8);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)pcVar8,(size_type)pCVar5);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)pcVar4,(shared_ptr<const_CTransaction> *)0xb82171);
  CKey::CKey(in_stack_ffffffffffffe278,
             (CKey *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270));
  CScript::CScript((CScript *)pcVar4,(CScript *)0xb821a4);
  pCVar6 = (CMutableTransaction *)&DAT_12a05f138;
  pCVar5 = (CMutableTransaction *)(local_3a0 + 0x20);
  uVar9 = (ulong)pcVar8 & 0xffffffff00000000;
  TestChain100Setup::CreateValidMempoolTransaction
            (in_stack_ffffffffffffe3f8,in_stack_ffffffffffffe3f0,
             (uint32_t)((ulong)in_stack_ffffffffffffe3e8 >> 0x20),(int)in_stack_ffffffffffffe3e8,
             in_stack_ffffffffffffe3e0,in_stack_ffffffffffffe580,in_stack_ffffffffffffe588,
             (bool)uVar11);
  ::MakeTransactionRef<CMutableTransaction>(pCVar6);
  CMutableTransaction::~CMutableTransaction(pCVar5);
  CScript::~CScript((CScript *)pCVar5);
  CKey::~CKey((CKey *)pCVar5);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pCVar5);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)pCVar5,(shared_ptr<const_CTransaction> *)0xb82256);
  CKey::CKey(in_stack_ffffffffffffe278,
             (CKey *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270));
  CScript::CScript((CScript *)pCVar5,(CScript *)0xb82282);
  pCVar6 = (CMutableTransaction *)0x12a05f070;
  pCVar5 = (CMutableTransaction *)local_3a0;
  pvVar7 = (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)(uVar9 & 0xffffffff00000000);
  TestChain100Setup::CreateValidMempoolTransaction
            (in_stack_ffffffffffffe3f8,in_stack_ffffffffffffe3f0,
             (uint32_t)((ulong)in_stack_ffffffffffffe3e8 >> 0x20),(int)in_stack_ffffffffffffe3e8,
             in_stack_ffffffffffffe3e0,in_stack_ffffffffffffe580,in_stack_ffffffffffffe588,
             (bool)uVar11);
  ::MakeTransactionRef<CMutableTransaction>(pCVar6);
  CMutableTransaction::~CMutableTransaction(pCVar5);
  CScript::~CScript((CScript *)pCVar5);
  CKey::~CKey((CKey *)pCVar5);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pCVar5);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[](pvVar7,(size_type)pCVar6);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)pCVar5,(shared_ptr<const_CTransaction> *)0xb8234a);
  CKey::CKey(in_stack_ffffffffffffe278,
             (CKey *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270));
  CScript::CScript((CScript *)pCVar5,(CScript *)0xb8237d);
  pCVar6 = (CMutableTransaction *)&DAT_12a05eee0;
  pCVar5 = (CMutableTransaction *)(local_3e0 + 0x20);
  uVar9 = (ulong)pvVar7 & 0xffffffff00000000;
  TestChain100Setup::CreateValidMempoolTransaction
            (in_stack_ffffffffffffe3f8,in_stack_ffffffffffffe3f0,
             (uint32_t)((ulong)in_stack_ffffffffffffe3e8 >> 0x20),(int)in_stack_ffffffffffffe3e8,
             in_stack_ffffffffffffe3e0,in_stack_ffffffffffffe580,in_stack_ffffffffffffe588,
             (bool)uVar11);
  ::MakeTransactionRef<CMutableTransaction>(pCVar6);
  CMutableTransaction::~CMutableTransaction(pCVar5);
  CScript::~CScript((CScript *)pCVar5);
  CKey::~CKey((CKey *)pCVar5);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pCVar5);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)pCVar5,(shared_ptr<const_CTransaction> *)0xb8242f);
  CKey::CKey(in_stack_ffffffffffffe278,
             (CKey *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270));
  CScript::CScript((CScript *)pCVar5,(CScript *)0xb8245b);
  pCVar6 = (CMutableTransaction *)0x12a05ee18;
  pCVar5 = (CMutableTransaction *)local_3e0;
  pvVar7 = (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)(uVar9 & 0xffffffff00000000);
  TestChain100Setup::CreateValidMempoolTransaction
            (in_stack_ffffffffffffe3f8,in_stack_ffffffffffffe3f0,
             (uint32_t)((ulong)in_stack_ffffffffffffe3e8 >> 0x20),(int)in_stack_ffffffffffffe3e8,
             in_stack_ffffffffffffe3e0,in_stack_ffffffffffffe580,in_stack_ffffffffffffe588,
             (bool)uVar11);
  ::MakeTransactionRef<CMutableTransaction>(pCVar6);
  CMutableTransaction::~CMutableTransaction(pCVar5);
  CScript::~CScript((CScript *)pCVar5);
  CKey::~CKey((CKey *)pCVar5);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pCVar5);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[](pvVar7,(size_type)pCVar6);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)pCVar5,(shared_ptr<const_CTransaction> *)0xb82523);
  CKey::CKey(in_stack_ffffffffffffe278,
             (CKey *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270));
  CScript::CScript((CScript *)pCVar5,(CScript *)0xb82556);
  pCVar6 = (CMutableTransaction *)0x12a05f139;
  pCVar5 = (CMutableTransaction *)(local_420 + 0x20);
  uVar9 = (ulong)pvVar7 & 0xffffffff00000000;
  TestChain100Setup::CreateValidMempoolTransaction
            (in_stack_ffffffffffffe3f8,in_stack_ffffffffffffe3f0,
             (uint32_t)((ulong)in_stack_ffffffffffffe3e8 >> 0x20),(int)in_stack_ffffffffffffe3e8,
             in_stack_ffffffffffffe3e0,in_stack_ffffffffffffe580,in_stack_ffffffffffffe588,
             (bool)uVar11);
  ::MakeTransactionRef<CMutableTransaction>(pCVar6);
  CMutableTransaction::~CMutableTransaction(pCVar5);
  CScript::~CScript((CScript *)pCVar5);
  CKey::~CKey((CKey *)pCVar5);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pCVar5);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)pCVar5,(shared_ptr<const_CTransaction> *)0xb82608);
  CKey::CKey(in_stack_ffffffffffffe278,
             (CKey *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270));
  CScript::CScript((CScript *)pCVar5,(CScript *)0xb82634);
  pCVar5 = (CMutableTransaction *)&DAT_12a05ec25;
  pcVar4 = local_420;
  pcVar8 = (char *)(uVar9 & 0xffffffff00000000);
  TestChain100Setup::CreateValidMempoolTransaction
            (in_stack_ffffffffffffe3f8,in_stack_ffffffffffffe3f0,
             (uint32_t)((ulong)in_stack_ffffffffffffe3e8 >> 0x20),(int)in_stack_ffffffffffffe3e8,
             in_stack_ffffffffffffe3e0,in_stack_ffffffffffffe580,in_stack_ffffffffffffe588,
             (bool)uVar11);
  ::MakeTransactionRef<CMutableTransaction>(pCVar5);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)pcVar4);
  CScript::~CScript((CScript *)pcVar4);
  CKey::~CKey((CKey *)pcVar4);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pcVar4);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar4);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe288,
               (const_string *)in_stack_ffffffffffffe280,(size_t)in_stack_ffffffffffffe278,
               (const_string *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270));
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               pcVar4);
    CTransaction::GetHash((CTransaction *)pcVar4);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               pcVar4);
    CTransaction::GetHash((CTransaction *)pcVar4);
    bVar2 = transaction_identifier<false>::operator!=
                      ((transaction_identifier<false> *)pcVar8,
                       (transaction_identifier<false> *)pCVar5);
    if (bVar2) {
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)pcVar4);
      CTransaction::GetHash((CTransaction *)pcVar4);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)pcVar4);
      CTransaction::GetHash((CTransaction *)pcVar4);
      transaction_identifier<false>::operator!=
                ((transaction_identifier<false> *)pcVar8,(transaction_identifier<false> *)pCVar5);
    }
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)pcVar8,SUB81((ulong)pCVar5 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    boost::unit_test::operator<<((lazy_ostream *)pCVar5,(basic_cstring<const_char> *)pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    pcVar4 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_ec8,local_ee8,local_f08,0x403,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pcVar4);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar4);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)pcVar4,(shared_ptr<const_CTransaction> *)0xb8291f);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)pcVar4,(shared_ptr<const_CTransaction> *)0xb82934);
  std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)pcVar4);
  __l._M_array._7_1_ = in_stack_ffffffffffffe297;
  __l._M_array._0_7_ = in_stack_ffffffffffffe290;
  __l._M_len = in_stack_ffffffffffffe298;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(in_stack_ffffffffffffe288,__l,(allocator_type *)in_stack_ffffffffffffe280);
  std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)pcVar4);
  local_1990 = local_420;
  do {
    local_1990 = local_1990 + -0x10;
    std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pcVar4);
  } while (local_1990 != local_440);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)pcVar4,(shared_ptr<const_CTransaction> *)0xb82a08);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)pcVar4,(shared_ptr<const_CTransaction> *)0xb82a1d);
  std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)pcVar4);
  __l_00._M_array._7_1_ = in_stack_ffffffffffffe297;
  __l_00._M_array._0_7_ = in_stack_ffffffffffffe290;
  __l_00._M_len = in_stack_ffffffffffffe298;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(in_stack_ffffffffffffe288,__l_00,(allocator_type *)in_stack_ffffffffffffe280);
  std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)pcVar4);
  local_19b8 = local_440;
  do {
    local_19b8 = local_19b8 + -0x10;
    std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pcVar4);
  } while (local_19b8 != local_460);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)pcVar4,(shared_ptr<const_CTransaction> *)0xb82af1);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)pcVar4,(shared_ptr<const_CTransaction> *)0xb82b06);
  std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)pcVar4);
  __l_01._M_array._7_1_ = in_stack_ffffffffffffe297;
  __l_01._M_array._0_7_ = in_stack_ffffffffffffe290;
  __l_01._M_len = in_stack_ffffffffffffe298;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(in_stack_ffffffffffffe288,__l_01,(allocator_type *)in_stack_ffffffffffffe280);
  std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)pcVar4);
  local_19e0 = local_460;
  do {
    local_19e0 = local_19e0 + -0x10;
    std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pcVar4);
  } while (local_19e0 != local_480);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar4);
  ChainstateManager::ActiveChainstate((ChainstateManager *)pcVar8);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator*
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar8);
  std::optional<CFeeRate>::optional();
  ProcessNewPackage(in_stack_ffffffffffffe2d0,in_stack_ffffffffffffe2c8,in_stack_ffffffffffffe2c0,
                    SUB81((ulong)in_stack_ffffffffffffe340 >> 0x38,0),
                    (optional<CFeeRate> *)
                    CONCAT17(in_stack_ffffffffffffe2bf,in_stack_ffffffffffffe2b8));
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::get
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar4);
  CheckPackageMempoolAcceptResult_abi_cxx11_
            (in_stack_ffffffffffffe3b0,
             (PackageMempoolAcceptResult *)
             CONCAT17(in_stack_ffffffffffffe3af,in_stack_ffffffffffffe3a8),
             SUB81((ulong)in_stack_ffffffffffffe3a0 >> 0x38,0),in_stack_ffffffffffffe398);
  bVar2 = std::optional::operator_cast_to_bool
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)pcVar4);
  if (bVar2) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar4);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffe288,
                 (const_string *)in_stack_ffffffffffffe280,(size_t)in_stack_ffffffffffffe278,
                 (const_string *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar8,SUB81((ulong)pCVar5 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)pcVar8);
      boost::unit_test::operator<<
                ((lazy_ostream *)pCVar5,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar4);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
      pcVar4 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_fa0,local_fc0,&local_fd0,0x40e,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)pcVar4);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar4);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)pcVar4);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             pcVar4);
  CTransaction::GetWitnessHash((CTransaction *)pcVar4);
  transaction_identifier::operator_cast_to_uint256_((transaction_identifier<true> *)pcVar4);
  std::
  map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  ::find((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
          *)pCVar5,(key_type *)pcVar4);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             pcVar4);
  CTransaction::GetWitnessHash((CTransaction *)pcVar4);
  transaction_identifier::operator_cast_to_uint256_((transaction_identifier<true> *)pcVar4);
  it_child_1_1 = std::
                 map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                 ::find((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                         *)pCVar5,(key_type *)pcVar4);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar4);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe288,
               (const_string *)in_stack_ffffffffffffe280,(size_t)in_stack_ffffffffffffe278,
               (const_string *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pCVar5,(char (*) [1])pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::
             operator->((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)
                        pcVar4);
    local_1034._0_4_ = 0;
    pcVar8 = "MempoolAcceptResult::ResultType::VALID";
    pCVar5 = (CMutableTransaction *)local_1034;
    pcVar4 = "it_parent_1->second.m_result_type";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,MempoolAcceptResult::ResultType,MempoolAcceptResult::ResultType>
              (local_1034 + 0x14,local_1034 + 4,0x412,1,2,&ppVar3->second);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar4);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar4);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe288,
               (const_string *)in_stack_ffffffffffffe280,(size_t)in_stack_ffffffffffffe278,
               (const_string *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pCVar5,(char (*) [1])pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::
             operator->((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)
                        pcVar4);
    local_108c.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
    ._M_start._0_4_ = 0;
    pcVar8 = "MempoolAcceptResult::ResultType::VALID";
    pCVar5 = &local_108c;
    pcVar4 = "it_child_1->second.m_result_type";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,MempoolAcceptResult::ResultType,MempoolAcceptResult::ResultType>
              ((undefined1 *)
               ((long)&local_108c.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4),
               (undefined1 *)
               ((long)&local_108c.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start + 4),0x413,1,2,&ppVar3->second);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar4);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  expected_pool_size = expected_pool_size + 2;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar4);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe288,
               (const_string *)in_stack_ffffffffffffe280,(size_t)in_stack_ffffffffffffe278,
               (const_string *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pCVar5,(char (*) [1])pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
              ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar4);
    local_10e8 = CTxMemPool::size((CTxMemPool *)pcVar8);
    pcVar8 = "expected_pool_size";
    pCVar5 = (CMutableTransaction *)&expected_pool_size;
    pcVar4 = "m_node.mempool->size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_10d0,local_10e0,0x415,1,2,&local_10e8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar4);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar4);
  ChainstateManager::ActiveChainstate((ChainstateManager *)pcVar8);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator*
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar8);
  std::optional<CFeeRate>::optional();
  ProcessNewPackage(in_stack_ffffffffffffe2d0,in_stack_ffffffffffffe2c8,in_stack_ffffffffffffe2c0,
                    SUB81((ulong)in_stack_ffffffffffffe340 >> 0x38,0),
                    (optional<CFeeRate> *)
                    CONCAT17(in_stack_ffffffffffffe2bf,in_stack_ffffffffffffe2b8));
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::get
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar4);
  CheckPackageMempoolAcceptResult_abi_cxx11_
            (in_stack_ffffffffffffe3b0,
             (PackageMempoolAcceptResult *)
             CONCAT17(in_stack_ffffffffffffe3af,in_stack_ffffffffffffe3a8),
             SUB81((ulong)in_stack_ffffffffffffe3a0 >> 0x38,0),in_stack_ffffffffffffe398);
  bVar2 = std::optional::operator_cast_to_bool
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)pcVar4);
  if (bVar2) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar4);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffe288,
                 (const_string *)in_stack_ffffffffffffe280,(size_t)in_stack_ffffffffffffe278,
                 (const_string *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar8,SUB81((ulong)pCVar5 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)pcVar8);
      boost::unit_test::operator<<
                ((lazy_ostream *)pCVar5,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar4);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
      pcVar4 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_1120,local_1140,&local_1150,0x41b,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)pcVar4);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar4);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)pcVar4);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             pcVar4);
  CTransaction::GetWitnessHash((CTransaction *)pcVar4);
  transaction_identifier::operator_cast_to_uint256_((transaction_identifier<true> *)pcVar4);
  std::
  map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  ::find((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
          *)pCVar5,(key_type *)pcVar4);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             pcVar4);
  CTransaction::GetWitnessHash((CTransaction *)pcVar4);
  transaction_identifier::operator_cast_to_uint256_((transaction_identifier<true> *)pcVar4);
  it_child_2_1 = std::
                 map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                 ::find((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                         *)pCVar5,(key_type *)pcVar4);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar4);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe288,
               (const_string *)in_stack_ffffffffffffe280,(size_t)in_stack_ffffffffffffe278,
               (const_string *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pCVar5,(char (*) [1])pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::
             operator->((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)
                        pcVar4);
    local_11b4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
    ._M_start._0_4_ = 0;
    pcVar8 = "MempoolAcceptResult::ResultType::VALID";
    pCVar5 = &local_11b4;
    pcVar4 = "it_parent_2->second.m_result_type";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,MempoolAcceptResult::ResultType,MempoolAcceptResult::ResultType>
              ((undefined1 *)
               ((long)&local_11b4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4),
               (undefined1 *)
               ((long)&local_11b4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start + 4),0x41f,1,2,&ppVar3->second);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar4);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar4);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe288,
               (const_string *)in_stack_ffffffffffffe280,(size_t)in_stack_ffffffffffffe278,
               (const_string *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pCVar5,(char (*) [1])pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::
             operator->((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)
                        pcVar4);
    local_120c.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
    ._M_start._0_4_ = 0;
    pcVar8 = "MempoolAcceptResult::ResultType::VALID";
    pCVar5 = &local_120c;
    pcVar4 = "it_child_2->second.m_result_type";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,MempoolAcceptResult::ResultType,MempoolAcceptResult::ResultType>
              ((undefined1 *)
               ((long)&local_120c.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4),
               (undefined1 *)
               ((long)&local_120c.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start + 4),0x420,1,2,&ppVar3->second);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar4);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar4);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe288,
               (const_string *)in_stack_ffffffffffffe280,(size_t)in_stack_ffffffffffffe278,
               (const_string *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pCVar5,(char (*) [1])pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
              ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar4);
    local_1268 = CTxMemPool::size((CTxMemPool *)pcVar8);
    pcVar8 = "expected_pool_size";
    pCVar5 = (CMutableTransaction *)&expected_pool_size;
    pcVar4 = "m_node.mempool->size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_1250,local_1260,0x421,1,2,&local_1268);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar4);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
    expect_valid = (undefined1)((ulong)in_stack_ffffffffffffe3a0 >> 0x38);
    uVar11 = (undefined1)((ulong)in_stack_ffffffffffffe340 >> 0x38);
  } while (bVar2);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar4);
  ChainstateManager::ActiveChainstate((ChainstateManager *)pcVar8);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator*
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar8);
  std::optional<CFeeRate>::optional();
  ProcessNewPackage(in_stack_ffffffffffffe2d0,in_stack_ffffffffffffe2c8,in_stack_ffffffffffffe2c0,
                    (bool)uVar11,
                    (optional<CFeeRate> *)
                    CONCAT17(in_stack_ffffffffffffe2bf,in_stack_ffffffffffffe2b8));
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::get
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar4);
  CheckPackageMempoolAcceptResult_abi_cxx11_
            (in_stack_ffffffffffffe3b0,
             (PackageMempoolAcceptResult *)
             CONCAT17(in_stack_ffffffffffffe3af,in_stack_ffffffffffffe3a8),(bool)expect_valid,
             in_stack_ffffffffffffe398);
  bVar2 = std::optional::operator_cast_to_bool
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)pcVar4);
  if (bVar2) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar4);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffe288,
                 (const_string *)in_stack_ffffffffffffe280,(size_t)in_stack_ffffffffffffe278,
                 (const_string *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar8,SUB81((ulong)pCVar5 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)pcVar8);
      boost::unit_test::operator<<
                ((lazy_ostream *)pCVar5,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar4);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
      pcVar4 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_12a0,local_12c0,&local_12d0,0x426,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)pcVar4);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar4);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)pcVar4);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             pcVar4);
  CTransaction::GetWitnessHash((CTransaction *)pcVar4);
  transaction_identifier::operator_cast_to_uint256_((transaction_identifier<true> *)pcVar4);
  std::
  map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  ::find((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
          *)pCVar5,(key_type *)pcVar4);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             pcVar4);
  CTransaction::GetWitnessHash((CTransaction *)pcVar4);
  transaction_identifier::operator_cast_to_uint256_((transaction_identifier<true> *)pcVar4);
  it_child_3 = std::
               map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
               ::find((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                       *)pCVar5,(key_type *)pcVar4);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar4);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe288,
               (const_string *)in_stack_ffffffffffffe280,(size_t)in_stack_ffffffffffffe278,
               (const_string *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pCVar5,(char (*) [1])pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::
             operator->((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)
                        pcVar4);
    local_1334.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
    ._M_start._0_4_ = 0;
    pcVar8 = "MempoolAcceptResult::ResultType::VALID";
    pCVar5 = &local_1334;
    pcVar4 = "it_parent_3->second.m_result_type";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,MempoolAcceptResult::ResultType,MempoolAcceptResult::ResultType>
              ((undefined1 *)
               ((long)&local_1334.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4),
               (undefined1 *)
               ((long)&local_1334.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start + 4),0x42a,1,2,&ppVar3->second);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar4);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar4);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe288,
               (const_string *)in_stack_ffffffffffffe280,(size_t)in_stack_ffffffffffffe278,
               (const_string *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pCVar5,(char (*) [1])pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::
             operator->((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)
                        pcVar4);
    local_138c.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
    ._M_start._0_4_ = 0;
    pcVar8 = "MempoolAcceptResult::ResultType::VALID";
    pCVar5 = &local_138c;
    pcVar4 = "it_child_3->second.m_result_type";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,MempoolAcceptResult::ResultType,MempoolAcceptResult::ResultType>
              ((undefined1 *)
               ((long)&local_138c.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4),
               (undefined1 *)
               ((long)&local_138c.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start + 4),0x42b,1,2,&ppVar3->second);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar4);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar4);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe288,
               (const_string *)in_stack_ffffffffffffe280,(size_t)in_stack_ffffffffffffe278,
               (const_string *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270));
    std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar4);
    std::__cxx11::
    list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::size((list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)pcVar4);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)pcVar8,SUB81((ulong)pCVar5 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    boost::unit_test::operator<<((lazy_ostream *)pCVar5,(basic_cstring<const_char> *)pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    pcVar4 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_13c8,local_13e8,local_1408,0x42e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pcVar4);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar4);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar4);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe288,
               (const_string *)in_stack_ffffffffffffe280,(size_t)in_stack_ffffffffffffe278,
               (const_string *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270));
    std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar4);
    std::__cxx11::
    list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::empty((list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)pcVar4);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)pcVar8,SUB81((ulong)pCVar5 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    boost::unit_test::operator<<((lazy_ostream *)pCVar5,(basic_cstring<const_char> *)pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    pcVar4 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1440,local_1460,local_1480,0x42f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pcVar4);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar4);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             pcVar4);
  CTransaction::GetWitnessHash((CTransaction *)pcVar4);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             pcVar4);
  CTransaction::GetWitnessHash((CTransaction *)pcVar4);
  std::allocator<transaction_identifier<true>_>::allocator
            ((allocator<transaction_identifier<true>_> *)pcVar4);
  __l_02._M_array._7_1_ = in_stack_ffffffffffffe297;
  __l_02._M_array._0_7_ = in_stack_ffffffffffffe290;
  __l_02._M_len = in_stack_ffffffffffffe298;
  std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::vector
            ((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *
             )in_stack_ffffffffffffe288,__l_02,(allocator_type *)in_stack_ffffffffffffe280);
  std::allocator<transaction_identifier<true>_>::~allocator
            ((allocator<transaction_identifier<true>_> *)pcVar4);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             pcVar8);
  GetVirtualTransactionSize((CTransaction *)pcVar4);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             pcVar8);
  GetVirtualTransactionSize((CTransaction *)pcVar4);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar4);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe288,
               (const_string *)in_stack_ffffffffffffe280,(size_t)in_stack_ffffffffffffe278,
               (const_string *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270));
    std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar4);
    std::
    optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
    ::value((optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
             *)pcVar8);
    std::operator==((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                     *)in_stack_ffffffffffffe278,
                    (vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                     *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)pcVar8,SUB81((ulong)pCVar5 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    boost::unit_test::operator<<((lazy_ostream *)pCVar5,(basic_cstring<const_char> *)pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    pcVar4 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_14d8,local_14f8,local_1518,0x433,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pcVar4);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar4);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar4);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe288,
               (const_string *)in_stack_ffffffffffffe280,(size_t)in_stack_ffffffffffffe278,
               (const_string *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270));
    std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar4);
    std::
    optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
    ::value((optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
             *)pcVar8);
    std::operator==((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                     *)in_stack_ffffffffffffe278,
                    (vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                     *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)pcVar8,SUB81((ulong)pCVar5 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    boost::unit_test::operator<<((lazy_ostream *)pCVar5,(basic_cstring<const_char> *)pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    pcVar4 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1550,local_1570,local_1590,0x434,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pcVar4);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar4);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar4);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe288,
               (const_string *)in_stack_ffffffffffffe280,(size_t)in_stack_ffffffffffffe278,
               (const_string *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pCVar5,(char (*) [1])pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar4);
    std::optional<CFeeRate>::value((optional<CFeeRate> *)pcVar8);
    local_15ec.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
    ._4_8_ = CFeeRate::GetFee((CFeeRate *)
                              CONCAT44(in_stack_ffffffffffffe26c,in_stack_ffffffffffffe268),
                              in_stack_ffffffffffffe264);
    local_15ec.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
    ._M_start._0_4_ = 0x5db;
    pcVar8 = "199 + 1300";
    pCVar5 = &local_15ec;
    pcVar4 = "it_parent_3->second.m_effective_feerate.value().GetFee(package3_total_vsize)";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              ((undefined1 *)
               ((long)&local_15ec.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                       super__Vector_impl_data._M_start + 4),
               (undefined1 *)
               ((long)&local_15ec.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_finish + 4),0x435,1,2,
               (undefined1 *)
               ((long)&local_15ec.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar4);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar4);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe288,
               (const_string *)in_stack_ffffffffffffe280,(size_t)in_stack_ffffffffffffe278,
               (const_string *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pCVar5,(char (*) [1])pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)pcVar4);
    std::optional<CFeeRate>::value((optional<CFeeRate> *)pcVar8);
    local_164c.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
    ._4_8_ = CFeeRate::GetFee((CFeeRate *)
                              CONCAT44(in_stack_ffffffffffffe26c,in_stack_ffffffffffffe268),
                              in_stack_ffffffffffffe264);
    local_164c.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
    ._M_start._0_4_ = 0x5db;
    pcVar8 = "199 + 1300";
    pCVar5 = &local_164c;
    pcVar4 = "it_child_3->second.m_effective_feerate.value().GetFee(package3_total_vsize)";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              ((undefined1 *)
               ((long)&local_164c.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                       super__Vector_impl_data._M_start + 4),
               (undefined1 *)
               ((long)&local_164c.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_finish + 4),0x436,1,2,
               (undefined1 *)
               ((long)&local_164c.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar4);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    this_01 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar4);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_01,(const_string *)in_stack_ffffffffffffe280,(size_t)in_stack_ffffffffffffe278,
               (const_string *)CONCAT17(in_stack_ffffffffffffe277,in_stack_ffffffffffffe270));
    in_stack_ffffffffffffe280 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pCVar5,(char (*) [1])pcVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar8,(pointer)pCVar5,(unsigned_long)pcVar4);
    std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
              ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)pcVar4);
    in_stack_ffffffffffffe278 = (CKey *)CTxMemPool::size((CTxMemPool *)pcVar8);
    pcVar8 = "expected_pool_size";
    pCVar5 = (CMutableTransaction *)&expected_pool_size;
    pcVar4 = "m_node.mempool->size()";
    local_16a8 = in_stack_ffffffffffffe278;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_1690,local_16a0,0x438,1,2,&local_16a8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar4);
    in_stack_ffffffffffffe277 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffe277);
  std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::~vector
            ((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *
             )pcVar8);
  PackageMempoolAcceptResult::~PackageMempoolAcceptResult((PackageMempoolAcceptResult *)pcVar4);
  PackageMempoolAcceptResult::~PackageMempoolAcceptResult((PackageMempoolAcceptResult *)pcVar4);
  PackageMempoolAcceptResult::~PackageMempoolAcceptResult((PackageMempoolAcceptResult *)pcVar4);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)pcVar8);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)pcVar8);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)pcVar8);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pcVar4);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pcVar4);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pcVar4);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pcVar4);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pcVar4);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pcVar4);
  CScript::~CScript((CScript *)pcVar4);
  CKey::~CKey((CKey *)pcVar4);
  CScript::~CScript((CScript *)pcVar4);
  CKey::~CKey((CKey *)pcVar4);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)pcVar4);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(package_rbf_tests)
{
    mineBlocks(5);
    LOCK(::cs_main);
    size_t expected_pool_size = m_node.mempool->size();
    CKey child_key{GenerateRandomKey()};
    CScript parent_spk = GetScriptForDestination(WitnessV0KeyHash(child_key.GetPubKey()));
    CKey grandchild_key{GenerateRandomKey()};
    CScript child_spk = GetScriptForDestination(WitnessV0KeyHash(grandchild_key.GetPubKey()));

    const CAmount coinbase_value{50 * COIN};
    // Test that de-duplication works. This is not actually package rbf.
    {
        // 1 parent paying 200sat, 1 child paying 300sat
        Package package1;
        // 1 parent paying 200sat, 1 child paying 500sat
        Package package2;
        // Package1 and package2 have the same parent. The children conflict.
        auto mtx_parent = CreateValidMempoolTransaction(/*input_transaction=*/m_coinbase_txns[0], /*input_vout=*/0,
                                                        /*input_height=*/0, /*input_signing_key=*/coinbaseKey,
                                                        /*output_destination=*/parent_spk,
                                                        /*output_amount=*/coinbase_value - low_fee_amt, /*submit=*/false);
        CTransactionRef tx_parent = MakeTransactionRef(mtx_parent);
        package1.push_back(tx_parent);
        package2.push_back(tx_parent);

        CTransactionRef tx_child_1 = MakeTransactionRef(CreateValidMempoolTransaction(tx_parent, 0, 101, child_key, child_spk, coinbase_value - low_fee_amt - 300, false));
        package1.push_back(tx_child_1);
        CTransactionRef tx_child_2 = MakeTransactionRef(CreateValidMempoolTransaction(tx_parent, 0, 101, child_key, child_spk, coinbase_value - low_fee_amt - 500, false));
        package2.push_back(tx_child_2);

        LOCK(m_node.mempool->cs);
        const auto submit1 = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool, package1, /*test_accept=*/false, std::nullopt);
        if (auto err_1{CheckPackageMempoolAcceptResult(package1, submit1, /*expect_valid=*/true, m_node.mempool.get())}) {
            BOOST_ERROR(err_1.value());
        }

        // Check precise ResultTypes and mempool size. We know it_parent_1 and it_child_1 exist from above call
        auto it_parent_1 = submit1.m_tx_results.find(tx_parent->GetWitnessHash());
        auto it_child_1 = submit1.m_tx_results.find(tx_child_1->GetWitnessHash());
        BOOST_CHECK_EQUAL(it_parent_1->second.m_result_type, MempoolAcceptResult::ResultType::VALID);
        BOOST_CHECK_EQUAL(it_child_1->second.m_result_type, MempoolAcceptResult::ResultType::VALID);
        expected_pool_size += 2;
        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);

        const auto submit2 = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool, package2, /*test_accept=*/false, std::nullopt);
        if (auto err_2{CheckPackageMempoolAcceptResult(package2, submit2, /*expect_valid=*/true, m_node.mempool.get())}) {
            BOOST_ERROR(err_2.value());
        }

        // Check precise ResultTypes and mempool size. We know it_parent_2 and it_child_2 exist from above call
        auto it_parent_2 = submit2.m_tx_results.find(tx_parent->GetWitnessHash());
        auto it_child_2 = submit2.m_tx_results.find(tx_child_2->GetWitnessHash());
        BOOST_CHECK_EQUAL(it_parent_2->second.m_result_type, MempoolAcceptResult::ResultType::MEMPOOL_ENTRY);
        BOOST_CHECK_EQUAL(it_child_2->second.m_result_type, MempoolAcceptResult::ResultType::VALID);
        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);

        // child1 has been replaced
        BOOST_CHECK(!m_node.mempool->exists(GenTxid::Txid(tx_child_1->GetHash())));
    }

    // Test package rbf.
    {
        CTransactionRef tx_parent_1 = MakeTransactionRef(CreateValidMempoolTransaction(
            m_coinbase_txns[1], /*input_vout=*/0, /*input_height=*/0,
            coinbaseKey, parent_spk, coinbase_value - 200, /*submit=*/false));
        CTransactionRef tx_child_1 = MakeTransactionRef(CreateValidMempoolTransaction(
            tx_parent_1, /*input_vout=*/0, /*input_height=*/101,
            child_key, child_spk, coinbase_value - 400, /*submit=*/false));

        CTransactionRef tx_parent_2 = MakeTransactionRef(CreateValidMempoolTransaction(
            m_coinbase_txns[1], /*input_vout=*/0, /*input_height=*/0,
            coinbaseKey, parent_spk, coinbase_value - 800, /*submit=*/false));
        CTransactionRef tx_child_2 = MakeTransactionRef(CreateValidMempoolTransaction(
            tx_parent_2, /*input_vout=*/0, /*input_height=*/101,
            child_key, child_spk, coinbase_value - 800 - 200, /*submit=*/false));

        CTransactionRef tx_parent_3 = MakeTransactionRef(CreateValidMempoolTransaction(
            m_coinbase_txns[1], /*input_vout=*/0, /*input_height=*/0,
            coinbaseKey, parent_spk, coinbase_value - 199, /*submit=*/false));
        CTransactionRef tx_child_3 = MakeTransactionRef(CreateValidMempoolTransaction(
            tx_parent_3, /*input_vout=*/0, /*input_height=*/101,
            child_key, child_spk, coinbase_value - 199 - 1300, /*submit=*/false));

        // In all packages, the parents conflict with each other
        BOOST_CHECK(tx_parent_1->GetHash() != tx_parent_2->GetHash() && tx_parent_2->GetHash() != tx_parent_3->GetHash());

        // 1 parent paying 200sat, 1 child paying 200sat.
        Package package1{tx_parent_1, tx_child_1};
        // 1 parent paying 800sat, 1 child paying 200sat.
        Package package2{tx_parent_2, tx_child_2};
        // 1 parent paying 199sat, 1 child paying 1300sat.
        Package package3{tx_parent_3, tx_child_3};

        const auto submit1 = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool, package1, false, std::nullopt);
        if (auto err_1{CheckPackageMempoolAcceptResult(package1, submit1, /*expect_valid=*/true, m_node.mempool.get())}) {
            BOOST_ERROR(err_1.value());
        }
        auto it_parent_1 = submit1.m_tx_results.find(tx_parent_1->GetWitnessHash());
        auto it_child_1 = submit1.m_tx_results.find(tx_child_1->GetWitnessHash());
        BOOST_CHECK_EQUAL(it_parent_1->second.m_result_type, MempoolAcceptResult::ResultType::VALID);
        BOOST_CHECK_EQUAL(it_child_1->second.m_result_type, MempoolAcceptResult::ResultType::VALID);
        expected_pool_size += 2;
        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);

        // This replacement is actually not package rbf; the parent carries enough fees
        // to replace the entire package on its own.
        const auto submit2 = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool, package2, false, std::nullopt);
        if (auto err_2{CheckPackageMempoolAcceptResult(package2, submit2, /*expect_valid=*/true, m_node.mempool.get())}) {
            BOOST_ERROR(err_2.value());
        }
        auto it_parent_2 = submit2.m_tx_results.find(tx_parent_2->GetWitnessHash());
        auto it_child_2 = submit2.m_tx_results.find(tx_child_2->GetWitnessHash());
        BOOST_CHECK_EQUAL(it_parent_2->second.m_result_type, MempoolAcceptResult::ResultType::VALID);
        BOOST_CHECK_EQUAL(it_child_2->second.m_result_type, MempoolAcceptResult::ResultType::VALID);
        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);

        // Package RBF, in which the replacement transaction's child sponsors the fees to meet RBF feerate rules
        const auto submit3 = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool, package3, false, std::nullopt);
        if (auto err_3{CheckPackageMempoolAcceptResult(package3, submit3, /*expect_valid=*/true, m_node.mempool.get())}) {
            BOOST_ERROR(err_3.value());
        }
        auto it_parent_3 = submit3.m_tx_results.find(tx_parent_3->GetWitnessHash());
        auto it_child_3 = submit3.m_tx_results.find(tx_child_3->GetWitnessHash());
        BOOST_CHECK_EQUAL(it_parent_3->second.m_result_type, MempoolAcceptResult::ResultType::VALID);
        BOOST_CHECK_EQUAL(it_child_3->second.m_result_type, MempoolAcceptResult::ResultType::VALID);

        // package3 was considered as a package to replace both package2 transactions
        BOOST_CHECK(it_parent_3->second.m_replaced_transactions.size() == 2);
        BOOST_CHECK(it_child_3->second.m_replaced_transactions.empty());

        std::vector<Wtxid> expected_package3_wtxids({tx_parent_3->GetWitnessHash(), tx_child_3->GetWitnessHash()});
        const auto package3_total_vsize{GetVirtualTransactionSize(*tx_parent_3) + GetVirtualTransactionSize(*tx_child_3)};
        BOOST_CHECK(it_parent_3->second.m_wtxids_fee_calculations.value() == expected_package3_wtxids);
        BOOST_CHECK(it_child_3->second.m_wtxids_fee_calculations.value() == expected_package3_wtxids);
        BOOST_CHECK_EQUAL(it_parent_3->second.m_effective_feerate.value().GetFee(package3_total_vsize), 199 + 1300);
        BOOST_CHECK_EQUAL(it_child_3->second.m_effective_feerate.value().GetFee(package3_total_vsize), 199 + 1300);

        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);
    }

}